

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

void __thiscall
helics::EndpointInfo::addSource
          (EndpointInfo *this,GlobalHandle source,string_view sourceName,string_view sourceType)

{
  bool bVar1;
  iterator this_00;
  iterator __args;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  *in_RDI;
  EndpointInformation *info;
  iterator __end1;
  iterator __begin1;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range1;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  GlobalHandle in_stack_ffffffffffffffb0;
  
  this_00 = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
            begin(in_stack_ffffffffffffff98);
  __args = std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
           end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      (in_RDI,(__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                               *)in_stack_ffffffffffffff98);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>::
      emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)this_00._M_current,&(__args._M_current)->id,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      return;
    }
    in_stack_ffffffffffffffb0 =
         (GlobalHandle)
         __gnu_cxx::
         __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
         ::operator*((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      *)&stack0xffffffffffffffc0);
    in_stack_ffffffffffffffa8 = in_RSI;
    bVar1 = GlobalHandle::operator==((GlobalHandle *)in_RSI,in_stack_ffffffffffffffb0);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
    ::operator++((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                  *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

void EndpointInfo::addSource(GlobalHandle source,
                             std::string_view sourceName,
                             std::string_view sourceType)
{
    for (const auto& info : sourceInformation) {
        if (info.id == source) {
            return;
        }
    }
    sourceInformation.emplace_back(source, sourceName, sourceType);
}